

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueUInt8::read(PLYValueUInt8 *this,int __fd,void *__buf,size_t __nbytes)

{
  uchar uVar1;
  
  uVar1 = std::streambuf::sbumpc();
  this->value = uVar1;
  return (ssize_t)this;
}

Assistant:

void read(std::streambuf *in) { value=static_cast<unsigned char>(in->sbumpc()); }